

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,_Bool overwrite_dst)

{
  wchar_t wVar1;
  ImWchar *pIVar2;
  char *__function;
  wchar_t wVar3;
  float fVar4;
  
  wVar1 = (this->IndexLookup).Size;
  if (wVar1 < L'\x01') {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xce2,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  wVar3 = (wchar_t)dst;
  if ((uint)dst < (uint)wVar1) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,dst + 1);
    if ((uint)src < (uint)wVar1) goto LAB_001cec4f;
    if ((this->IndexLookup).Size <= wVar3) goto LAB_001ceca5;
    (this->IndexLookup).Data[dst] = 0xffff;
    fVar4 = 1.0;
  }
  else {
    if ((uint)wVar1 <= (uint)src) {
      return;
    }
    GrowIndex(this,dst + 1);
LAB_001cec4f:
    if ((this->IndexLookup).Size <= wVar3) {
LAB_001ceca5:
      __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
      goto LAB_001cecd1;
    }
    pIVar2 = (this->IndexLookup).Data;
    pIVar2[dst] = pIVar2[src];
    fVar4 = (this->IndexAdvanceX).Data[src];
  }
  if (wVar3 < (this->IndexAdvanceX).Size) {
    (this->IndexAdvanceX).Data[dst] = fVar4;
    return;
  }
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_001cecd1:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x706,__function);
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}